

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O0

int __thiscall
anon_unknown.dwarf_3c4::NinjaMain::ToolClean(NinjaMain *this,Options *options,int argc,char **argv)

{
  int target_count;
  char **___argv;
  long lVar1;
  undefined1 local_d0 [8];
  Cleaner cleaner;
  int opt;
  bool clean_rules;
  bool generator;
  char **argv_local;
  int argc_local;
  Options *options_local;
  NinjaMain *this_local;
  
  ___argv = argv + -1;
  cleaner._151_1_ = 0;
  cleaner._150_1_ = 0;
  _optind = 1;
  while( true ) {
    while( true ) {
      cleaner.status_ = getopt(argc + 1,___argv,"hgr");
      if (cleaner.status_ == -1) {
        lVar1 = (long)_optind;
        target_count = (argc + 1) - _optind;
        if (((cleaner._150_1_ & 1) == 0) || (target_count != 0)) {
          Cleaner::Cleaner((Cleaner *)local_d0,&this->state_,this->config_,
                           &(this->disk_interface_).super_DiskInterface);
          if (target_count < 1) {
            this_local._4_4_ = Cleaner::CleanAll((Cleaner *)local_d0,(bool)(cleaner._151_1_ & 1));
          }
          else if ((cleaner._150_1_ & 1) == 0) {
            this_local._4_4_ =
                 Cleaner::CleanTargets((Cleaner *)local_d0,target_count,___argv + lVar1);
          }
          else {
            this_local._4_4_ = Cleaner::CleanRules((Cleaner *)local_d0,target_count,___argv + lVar1)
            ;
          }
          Cleaner::~Cleaner((Cleaner *)local_d0);
        }
        else {
          Error("expected a rule to clean");
          this_local._4_4_ = 1;
        }
        return this_local._4_4_;
      }
      if (cleaner.status_ != 0x67) break;
      cleaner._151_1_ = 1;
    }
    if ((cleaner.status_ == 0x68) || (cleaner.status_ != 0x72)) break;
    cleaner._150_1_ = 1;
  }
  printf(
        "usage: ninja -t clean [options] [targets]\n\noptions:\n  -g     also clean files marked as ninja generator output\n  -r     interpret targets as a list of rules to clean instead\n"
        );
  return 1;
}

Assistant:

int NinjaMain::ToolClean(const Options* options, int argc, char* argv[]) {
  // The clean tool uses getopt, and expects argv[0] to contain the name of
  // the tool, i.e. "clean".
  argc++;
  argv--;

  bool generator = false;
  bool clean_rules = false;

  optind = 1;
  int opt;
  while ((opt = getopt(argc, argv, const_cast<char*>("hgr"))) != -1) {
    switch (opt) {
    case 'g':
      generator = true;
      break;
    case 'r':
      clean_rules = true;
      break;
    case 'h':
    default:
      printf("usage: ninja -t clean [options] [targets]\n"
"\n"
"options:\n"
"  -g     also clean files marked as ninja generator output\n"
"  -r     interpret targets as a list of rules to clean instead\n"
             );
    return 1;
    }
  }
  argv += optind;
  argc -= optind;

  if (clean_rules && argc == 0) {
    Error("expected a rule to clean");
    return 1;
  }

  Cleaner cleaner(&state_, config_, &disk_interface_);
  if (argc >= 1) {
    if (clean_rules)
      return cleaner.CleanRules(argc, argv);
    else
      return cleaner.CleanTargets(argc, argv);
  } else {
    return cleaner.CleanAll(generator);
  }
}